

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::Base64UnescapeInternal(char *src,int slen,string *dest,char *unbase64)

{
  int iVar1;
  ulong in_RDX;
  int unaff_retaddr;
  char *in_stack_00000008;
  int in_stack_00000014;
  char *in_stack_00000018;
  int len;
  int dest_len;
  string *in_stack_ffffffffffffff60;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  std::__cxx11::string::resize(in_RDX);
  string_as_array(in_stack_ffffffffffffff60);
  iVar1 = Base64UnescapeInternal
                    (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
                     (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  if (-1 < iVar1) {
    std::__cxx11::string::erase(in_RDX,(long)iVar1);
  }
  else {
    std::__cxx11::string::clear();
  }
  return -1 < iVar1;
}

Assistant:

static bool Base64UnescapeInternal(const char* src, int slen, string* dest,
                                   const signed char* unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  any leftover chars are added directly for good measure.
  // This is documented in the base64 RFC: http://tools.ietf.org/html/rfc3548
  const int dest_len = 3 * (slen / 4) + (slen % 4);

  dest->resize(dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  const int len = Base64UnescapeInternal(src, slen, string_as_array(dest),
                                         dest_len, unbase64);
  if (len < 0) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  GOOGLE_DCHECK_LE(len, dest_len);
  dest->erase(len);

  return true;
}